

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O0

void N_VLinearSum_MultiFab(Real a,N_Vector x,Real b,N_Vector y,N_Vector z)

{
  FabArrayBase *this;
  MultiFab **ppMVar1;
  N_Vector in_RDX;
  N_Vector in_RSI;
  N_Vector in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  MultiFab *in_stack_00000008;
  sunindextype nghost;
  sunindextype ncomp;
  MultiFab *mf_z;
  MultiFab *mf_y;
  MultiFab *mf_x;
  
  ppMVar1 = amrex::sundials::getMFptr(in_RDI);
  this = (FabArrayBase *)*ppMVar1;
  amrex::sundials::getMFptr(in_RSI);
  amrex::sundials::getMFptr(in_RDX);
  amrex::FabArrayBase::nComp(this);
  amrex::MultiFab::LinComb
            ((MultiFab *)z,(Real)mf_x,mf_y,mf_z._4_4_,_nghost,in_stack_00000008,unaff_retaddr_00,
             unaff_retaddr,b._0_4_,(int)x);
  return;
}

Assistant:

void N_VLinearSum_MultiFab(amrex::Real a, N_Vector x, amrex::Real b, N_Vector y,
                              N_Vector z)
{
    amrex::MultiFab *mf_x = amrex::sundials::getMFptr(x);
    amrex::MultiFab *mf_y = amrex::sundials::getMFptr(y);
    amrex::MultiFab *mf_z = amrex::sundials::getMFptr(z);

    sunindextype ncomp = mf_x->nComp();
    //sunindextype nghost = mf_x->nGrow();
    sunindextype nghost = 0;  // do not include ghost cells

    amrex::MultiFab::LinComb(*mf_z, a, *mf_x, 0, b, *mf_y, 0, 0, ncomp, nghost);
}